

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O1

uint32_t __thiscall cppnet::BufferQueue::Write(BufferQueue *this,char *str,uint32_t len)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  element_type *peVar4;
  int iVar5;
  BufferBlock *__tmp;
  uint32_t uVar6;
  
  uVar6 = 0;
  if (len != 0 && str != (char *)0x0) {
    uVar6 = 0;
    while( true ) {
      if ((this->_buffer_write).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == (element_type *)0x0) {
        (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[0x13])(this);
        peVar1 = (this->_buffer_list)._tail.
                 super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var2 = (this->_buffer_list)._tail.
                 super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          }
        }
        (this->_buffer_write).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = peVar1;
        p_Var3 = (this->_buffer_write).
                 super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        (this->_buffer_write).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = p_Var2;
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
      }
      peVar1 = (this->_buffer_write).
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iVar5 = (*(peVar1->super_InnerBuffer).super_Buffer._vptr_Buffer[10])
                        (peVar1,str + uVar6,(ulong)(len - uVar6));
      uVar6 = uVar6 + iVar5;
      if (len <= uVar6) break;
      peVar1 = (this->_buffer_write).
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      peVar4 = (peVar1->super_ListSlot<cppnet::BufferBlock>)._next.
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var2 = (peVar1->super_ListSlot<cppnet::BufferBlock>)._next.
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      (this->_buffer_write).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar4;
      p_Var3 = (this->_buffer_write).
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      (this->_buffer_write).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var2;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
    }
    this->_can_read_length = this->_can_read_length + uVar6;
  }
  return uVar6;
}

Assistant:

uint32_t BufferQueue::Write(const char* str, uint32_t len) {
    if (!str || len == 0) {
        return 0;
    }
    
    uint32_t write_len = 0;

    while (1) {
        if (!_buffer_write) {
            Append();
            _buffer_write = _buffer_list.GetTail();
        }

        write_len += _buffer_write->Write(str + write_len, len - write_len);

        if (write_len >= len) {
            break;
        }
        _buffer_write = _buffer_write->GetNext();
    }
    _can_read_length += write_len;
    return write_len;
}